

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetExtensionIdentifierName_abi_cxx11_
          (string *__return_storage_ptr__,ClassNameResolver *this,FieldDescriptor *descriptor,
          bool immutable,bool kotlin)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  string local_38;
  
  GetClassName_abi_cxx11_(&local_38,this,*(Descriptor **)(descriptor + 0x20),immutable,kotlin);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_38);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_48 = *plVar3;
    lStack_40 = plVar2[3];
    local_58 = &local_48;
  }
  else {
    local_48 = *plVar3;
    local_58 = (long *)*plVar2;
  }
  local_50 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_58,**(ulong **)(descriptor + 8));
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_58 != &local_48) {
    operator_delete(local_58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNameResolver::GetExtensionIdentifierName(
    const FieldDescriptor* descriptor, bool immutable, bool kotlin) {
  return GetClassName(descriptor->containing_type(), immutable, kotlin) + "." +
         descriptor->name();
}